

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_activate_c(float **output,int channels,int width,int height,int stride,
                       ACTIVATION layer_activation)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000089;
  long lVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  
  iVar7 = (int)CONCAT71(in_register_00000089,layer_activation);
  if (iVar7 == 1) {
    uVar2 = 0;
    uVar4 = (ulong)(uint)width;
    if (width < 1) {
      uVar4 = uVar2;
    }
    uVar3 = (ulong)(uint)height;
    if (height < 1) {
      uVar3 = uVar2;
    }
    uVar6 = (ulong)(uint)channels;
    if (channels < 1) {
      uVar6 = uVar2;
    }
    for (; uVar2 != uVar6; uVar2 = uVar2 + 1) {
      lVar8 = 0;
      for (uVar9 = 0; lVar5 = lVar8, uVar10 = uVar4, uVar9 != uVar3; uVar9 = uVar9 + 1) {
        while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
          fVar1 = *(float *)((long)output[uVar2] + lVar5);
          fVar12 = 0.0;
          if (0.0 <= fVar1) {
            fVar12 = fVar1;
          }
          *(float *)((long)output[uVar2] + lVar5) = fVar12;
          lVar5 = lVar5 + 4;
        }
        lVar8 = lVar8 + (long)stride * 4;
      }
    }
  }
  else if (iVar7 == 2) {
    uVar2 = 0;
    uVar4 = (ulong)(uint)width;
    if (width < 1) {
      uVar4 = uVar2;
    }
    uVar3 = (ulong)(uint)height;
    if (height < 1) {
      uVar3 = uVar2;
    }
    uVar6 = (ulong)(uint)channels;
    if (channels < 1) {
      uVar6 = uVar2;
    }
    for (; uVar2 != uVar6; uVar2 = uVar2 + 1) {
      lVar8 = 0;
      for (uVar9 = 0; lVar5 = lVar8, uVar10 = uVar4, uVar9 != uVar3; uVar9 = uVar9 + 1) {
        while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
          fVar1 = *(float *)((long)output[uVar2] + lVar5);
          *(float *)((long)output[uVar2] + lVar5) = fVar1 / (ABS(fVar1) + 1.0);
          lVar5 = lVar5 + 4;
        }
        lVar8 = lVar8 + (long)stride * 4;
      }
    }
  }
  return;
}

Assistant:

void av1_cnn_activate_c(float **output, int channels, int width, int height,
                        int stride, ACTIVATION layer_activation) {
  if (layer_activation == RELU) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = relu(output[c][i * stride + j]);
    }
  } else if (layer_activation == SOFTSIGN) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = softsign(output[c][i * stride + j]);
    }
  } else if (layer_activation == SIGMOID) {
    assert(0 && "Sigmoid has not been supported in CNN.");  // TO DO
  } else if (layer_activation != NONE) {
    assert(0 && "Unknown activation type");
  }
}